

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

int __thiscall deqp::gls::VertexArrayTest::init(VertexArrayTest *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  int iVar1;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GLContext *this_00;
  TestLog *log;
  ReferenceContextBuffers *this_01;
  undefined4 extraout_var_01;
  PixelFormat *colorBits;
  ReferenceContext *this_02;
  ContextArrayPack *pCVar2;
  MultisamplePixelBufferAccess local_108;
  MultisamplePixelBufferAccess local_e0;
  MultisamplePixelBufferAccess local_b8;
  Vector<int,_4> local_8c;
  undefined1 local_70 [8];
  ReferenceContextLimits limits;
  int renderTargetHeight;
  int renderTargetWidth;
  VertexArrayTest *this_local;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar1 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar1));
  limits.extensionStr.field_2._12_4_ = de::min<int>(0x200,iVar1);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar1 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar1));
  limits.extensionStr.field_2._8_4_ = de::min<int>(0x200,iVar1);
  sglr::ReferenceContextLimits::ReferenceContextLimits
            ((ReferenceContextLimits *)local_70,this->m_renderCtx);
  this_00 = (GLContext *)operator_new(0x170);
  context = this->m_renderCtx;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::Vector<int,_4>::Vector
            (&local_8c,0,0,limits.extensionStr.field_2._12_4_,limits.extensionStr.field_2._8_4_);
  sglr::GLContext::GLContext(this_00,context,log,3,&local_8c);
  this->m_glesContext = (Context *)this_00;
  this_01 = (ReferenceContextBuffers *)operator_new(0x78);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  colorBits = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar1));
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (this_01,colorBits,0,0,limits.extensionStr.field_2._12_4_,
             limits.extensionStr.field_2._8_4_,1);
  this->m_refBuffers = this_01;
  this_02 = (ReferenceContext *)operator_new(0x61b0);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_b8,this->m_refBuffers);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_e0,this->m_refBuffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_108,this->m_refBuffers);
  sglr::ReferenceContext::ReferenceContext
            (this_02,(ReferenceContextLimits *)local_70,&local_b8,&local_e0,&local_108);
  this->m_refContext = this_02;
  pCVar2 = (ContextArrayPack *)operator_new(0x50);
  ContextArrayPack::ContextArrayPack(pCVar2,this->m_renderCtx,this->m_glesContext);
  this->m_glArrayPack = pCVar2;
  pCVar2 = (ContextArrayPack *)operator_new(0x50);
  ContextArrayPack::ContextArrayPack(pCVar2,this->m_renderCtx,&this->m_refContext->super_Context);
  this->m_rrArrayPack = pCVar2;
  sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)local_70);
  return extraout_EAX;
}

Assistant:

void VertexArrayTest::init (void)
{
	const int						renderTargetWidth	= de::min(512, m_renderCtx.getRenderTarget().getWidth());
	const int						renderTargetHeight	= de::min(512, m_renderCtx.getRenderTarget().getHeight());
	sglr::ReferenceContextLimits	limits				(m_renderCtx);

	m_glesContext		= new sglr::GLContext(m_renderCtx, m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));

	m_refBuffers		= new sglr::ReferenceContextBuffers(m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, renderTargetWidth, renderTargetHeight);
	m_refContext		= new sglr::ReferenceContext(limits, m_refBuffers->getColorbuffer(), m_refBuffers->getDepthbuffer(), m_refBuffers->getStencilbuffer());

	m_glArrayPack		= new ContextArrayPack(m_renderCtx, *m_glesContext);
	m_rrArrayPack		= new ContextArrayPack(m_renderCtx, *m_refContext);
}